

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O3

bool __thiscall
QFSFileEnginePrivate::nativeOpenImpl(QFSFileEnginePrivate *this,OpenMode openMode,mode_t mode)

{
  QAbstractFileEngine *this_00;
  DataPointer *pDVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  uint uVar8;
  QString *this_01;
  char *__file;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_98;
  QString local_78;
  NativePath local_58;
  undefined4 local_40;
  long local_38;
  storage_type *psVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
             super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 0x20) != 0) {
    this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
    uVar6 = 2;
    if ((~(uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 3) != 0) {
      uVar6 = (uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                    super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i >> 1 & 1;
    }
    uVar8 = uVar6 + 0x40;
    if (((uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
               super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 0x82) != 2) {
      uVar8 = uVar6;
    }
    uVar6 = ((uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                   super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 4) << 8 |
            ((uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                   super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 8) << 6;
    psVar7 = (storage_type *)(ulong)uVar6;
LAB_00131c18:
    QFileSystemEntry::nativeFilePath(&local_58,&this->fileEntry);
    __file = local_58.d.ptr;
    if (local_58.d.ptr == (char *)0x0) {
      __file = "";
    }
    do {
      iVar3 = open64(__file,uVar8 + uVar6 + ((uint)openMode.
                                                  super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>
                                                  .super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.
                                                  i & 0x40) * 2 + 0x80000,(ulong)mode);
      if (iVar3 != -1) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    this->fd = iVar3;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
      iVar3 = this->fd;
    }
    if (iVar3 == -1) goto code_r0x00131c8b;
    if (((((uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                 super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 2) == 0) &&
        (bVar2 = QFileSystemEngine::fillMetaData(iVar3,&this->metaData), bVar2)) &&
       (((this->metaData).entryFlags.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>
         .super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x40000) != 0)) {
      local_58.d.d = (Data *)0x206f7420656c6966;
      local_58.d.ptr = (char *)0x207369206e65706f;
      local_58.d.size = 0x7463657269642061;
      local_40 = 0x79726f;
      this_01 = (QString *)0xffffffffffffffff;
      do {
        pDVar1 = &this_01->d;
        this_01 = (QString *)((long)&(this_01->d).d + 1);
      } while (((undefined1 *)((long)&local_58.d.d + 1))[(long)&pDVar1->d] != '\0');
      ba.m_data = psVar7;
      ba.m_size = (qsizetype)&local_58;
      QString::fromLatin1(&local_78,this_01,ba);
      local_98.d.d = local_78.d.d;
      local_98.d.ptr = local_78.d.ptr;
      local_98.d.size = local_78.d.size;
      QAbstractFileEngine::setError(this_00,OpenError,&local_98);
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      iVar3 = this->fd;
      while (iVar4 = close(iVar3), iVar4 == -1) {
        piVar5 = __errno_location();
        bVar2 = false;
        if (*piVar5 != 4) goto LAB_00131cd5;
      }
      goto LAB_00131ca1;
    }
    this->fh = (FILE *)0x0;
  }
  this->closeFileHandle = true;
  bVar2 = true;
LAB_00131cd5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
code_r0x00131c8b:
  piVar5 = __errno_location();
  if (*piVar5 != 4) goto code_r0x00131c97;
  goto LAB_00131c18;
code_r0x00131c97:
  nativeOpenImpl();
LAB_00131ca1:
  bVar2 = false;
  goto LAB_00131cd5;
}

Assistant:

bool QFSFileEnginePrivate::nativeOpenImpl(QIODevice::OpenMode openMode, mode_t mode)
{
    Q_Q(QFSFileEngine);

    Q_ASSERT_X(openMode & QIODevice::Unbuffered, "QFSFileEngine::open",
               "QFSFileEngine no longer supports buffered mode; upper layer must buffer");
    if (openMode & QIODevice::Unbuffered) {
        int flags = openModeToOpenFlags(openMode);

        // Try to open the file in unbuffered mode.
        do {
            fd = QT_OPEN(fileEntry.nativeFilePath().constData(), flags, mode);
        } while (fd == -1 && errno == EINTR);

        // On failure, return and report the error.
        if (fd == -1) {
            q->setError(errno == EMFILE ? QFile::ResourceError : QFile::OpenError,
                        qt_error_string(errno));
            return false;
        }

        if (!(openMode & QIODevice::WriteOnly)) {
            // we don't need this check if we tried to open for writing because then
            // we had received EISDIR anyway.
            if (QFileSystemEngine::fillMetaData(fd, metaData)
                    && metaData.isDirectory()) {
                q->setError(QFile::OpenError, msgOpenDirectory());
                QT_CLOSE(fd);
                return false;
            }
        }

        // Seek to the end when in Append mode.
        if (flags & QFile::Append) {
            QT_OFF_T ret;
            do {
                ret = QT_LSEEK(fd, 0, SEEK_END);
            } while (ret == -1 && errno == EINTR);

            if (ret == -1) {
                q->setError(errno == EMFILE ? QFile::ResourceError : QFile::OpenError,
                            qt_error_string(errno));
                return false;
            }
        }

        fh = nullptr;
    }

    closeFileHandle = true;
    return true;
}